

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lundump.c
# Opt level: O2

LClosure * luaU_undump(lua_State *L,ZIO *Z,char *name)

{
  char cVar1;
  StkId pTVar2;
  lu_byte lVar3;
  byte bVar4;
  lua_Integer lVar5;
  LClosure *pLVar6;
  Proto *f;
  char *why;
  LClosure *x_;
  lua_Number lVar7;
  LoadState local_38;
  
  cVar1 = *name;
  if (cVar1 == '\x1b') {
    name = "binary string";
  }
  else if ((cVar1 == '@') || (cVar1 == '=')) {
    name = name + 1;
  }
  local_38.L = L;
  local_38.Z = Z;
  local_38.name = name;
  checkliteral(&local_38,"Lua","not a");
  lVar3 = LoadByte(&local_38);
  if (lVar3 == 'S') {
    lVar3 = LoadByte(&local_38);
    if (lVar3 == '\0') {
      checkliteral(&local_38,anon_var_dwarf_afc8,"corrupted");
      fchecksize(&local_38,4,"int");
      fchecksize(&local_38,8,"size_t");
      fchecksize(&local_38,4,"Instruction");
      fchecksize(&local_38,8,"lua_Integer");
      fchecksize(&local_38,8,"lua_Number");
      lVar5 = LoadInteger(&local_38);
      if (lVar5 == 0x5678) {
        lVar7 = LoadNumber(&local_38);
        if ((lVar7 == 370.5) && (!NAN(lVar7))) {
          bVar4 = LoadByte(&local_38);
          pLVar6 = luaF_newLclosure(L,(uint)bVar4);
          pTVar2 = L->top;
          (pTVar2->value_).gc = (GCObject *)pLVar6;
          pTVar2->tt_ = 0x46;
          luaD_inctop(L);
          f = luaF_newproto(L);
          pLVar6->p = f;
          LoadFunction(&local_38,f,(TString *)0x0);
          return pLVar6;
        }
        why = "float format mismatch in";
      }
      else {
        why = "endianness mismatch in";
      }
    }
    else {
      why = "format mismatch in";
    }
  }
  else {
    why = "version mismatch in";
  }
  error(&local_38,why);
}

Assistant:

LClosure *luaU_undump(lua_State *L, ZIO *Z, const char *name) {
  LoadState S;
  LClosure *cl;
  if (*name == '@' || *name == '=')
    S.name = name + 1;
  else if (*name == LUA_SIGNATURE[0])
    S.name = "binary string";
  else
    S.name = name;
  S.L = L;
  S.Z = Z;
  checkHeader(&S);
  cl = luaF_newLclosure(L, LoadByte(&S));
  setclLvalue(L, L->top, cl);
  luaD_inctop(L);
  cl->p = luaF_newproto(L);
  LoadFunction(&S, cl->p, NULL);
  lua_assert(cl->nupvalues == cl->p->sizeupvalues);
  luai_verifycode(L, buff, cl->p);
  return cl;
}